

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

AMQP_VALUE amqpvalue_create_flow(FLOW_HANDLE flow)

{
  FLOW_INSTANCE *flow_instance;
  AMQP_VALUE result;
  FLOW_HANDLE flow_local;
  
  if (flow == (FLOW_HANDLE)0x0) {
    flow_instance = (FLOW_INSTANCE *)0x0;
  }
  else {
    flow_instance = (FLOW_INSTANCE *)amqpvalue_clone(flow->composite_value);
  }
  return (AMQP_VALUE)flow_instance;
}

Assistant:

AMQP_VALUE amqpvalue_create_flow(FLOW_HANDLE flow)
{
    AMQP_VALUE result;

    if (flow == NULL)
    {
        result = NULL;
    }
    else
    {
        FLOW_INSTANCE* flow_instance = (FLOW_INSTANCE*)flow;
        result = amqpvalue_clone(flow_instance->composite_value);
    }

    return result;
}